

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O3

void C_ReadCVars(BYTE **demo_p)

{
  char *__s;
  FBaseCVar *this;
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  UCVarValue value;
  BYTE *pBVar6;
  TArray<FBaseCVar_*,_FBaseCVar_*> cvars;
  TArray<FBaseCVar_*,_FBaseCVar_*> local_48;
  
  pBVar6 = *demo_p;
  if (*pBVar6 == '\\') {
    if (pBVar6[1] == '\\') {
      local_48.Array = (FBaseCVar **)0x0;
      local_48.Most = 0;
      local_48.Count = 0;
      pcVar2 = strchr((char *)(pBVar6 + 2),0x5c);
      *pcVar2 = '\0';
      uVar3 = strtoul((char *)(pBVar6 + 2),(char **)0x0,0x10);
      *pcVar2 = '\\';
      FilterCompactCVars(&local_48,(DWORD)uVar3);
      while (local_48.Count != 0) {
        value.String = pcVar2 + 1;
        uVar1 = local_48.Count - 1;
        local_48.Count = uVar1;
        this = local_48.Array[uVar1];
        pcVar2 = strchr(value.String,0x5c);
        if (pcVar2 != (char *)0x0) {
          *pcVar2 = '\0';
        }
        FBaseCVar::ForceSet(this,value,CVAR_String,false);
        if (pcVar2 == (char *)0x0) break;
        *pcVar2 = '\\';
      }
      TArray<FBaseCVar_*,_FBaseCVar_*>::~TArray(&local_48);
    }
    else {
      pBVar6 = pBVar6 + 1;
      pcVar2 = strchr((char *)pBVar6,0x5c);
      while (pcVar2 != (char *)0x0) {
        *pcVar2 = '\0';
        __s = pcVar2 + 1;
        pcVar4 = strchr(__s,0x5c);
        if (pcVar4 == (char *)0x0) {
          cvar_set((char *)pBVar6,__s);
          *pcVar2 = '\\';
          break;
        }
        *pcVar4 = '\0';
        cvar_set((char *)pBVar6,__s);
        *pcVar2 = '\\';
        *pcVar4 = '\\';
        pBVar6 = (BYTE *)(pcVar4 + 1);
        pcVar2 = strchr((char *)pBVar6,0x5c);
      }
    }
    pBVar6 = *demo_p;
    sVar5 = strlen((char *)pBVar6);
    *demo_p = pBVar6 + sVar5 + 1;
  }
  return;
}

Assistant:

void C_ReadCVars (BYTE **demo_p)
{
	char *ptr = *((char **)demo_p);
	char *breakpt;

	if (*ptr++ != '\\')
		return;

	if (*ptr == '\\')
	{       // compact mode
		TArray<FBaseCVar *> cvars;
		FBaseCVar *cvar;
		DWORD filter;

		ptr++;
		breakpt = strchr (ptr, '\\');
		*breakpt = 0;
		filter = strtoul (ptr, NULL, 16);
		*breakpt = '\\';
		ptr = breakpt + 1;

		FilterCompactCVars (cvars, filter);

		while (cvars.Pop (cvar))
		{
			UCVarValue val;
			breakpt = strchr (ptr, '\\');
			if (breakpt)
				*breakpt = 0;
			val.String = ptr;
			cvar->ForceSet (val, CVAR_String);
			if (breakpt)
			{
				*breakpt = '\\';
				ptr = breakpt + 1;
			}
			else
				break;
		}
	}
	else
	{
		char *value;

		while ( (breakpt = strchr (ptr, '\\')) )
		{
			*breakpt = 0;
			value = breakpt + 1;
			if ( (breakpt = strchr (value, '\\')) )
				*breakpt = 0;

			cvar_set (ptr, value);

			*(value - 1) = '\\';
			if (breakpt)
			{
				*breakpt = '\\';
				ptr = breakpt + 1;
			}
			else
			{
				break;
			}
		}
	}
	*demo_p += strlen (*((char **)demo_p)) + 1;
}